

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZipReader.cpp
# Opt level: O1

IReadFile * __thiscall irr::io::CZipReader::createAndOpenFile(CZipReader *this,u32 index)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  _func_int **pp_Var4;
  pointer pSVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  IReadFile *pIVar9;
  undefined4 extraout_var;
  long lVar10;
  char *this_00;
  ulong areaSize;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  char buf [64];
  Printer aPStack_e8 [72];
  void *local_a0;
  uint local_98;
  void *local_88;
  uint local_80;
  undefined8 local_60;
  undefined8 uStack_58;
  
  pp_Var4 = this->_vptr_CZipReader;
  pSVar5 = (this->FileInfo).m_data.
           super__Vector_base<irr::io::SZipFileEntry,_std::allocator<irr::io::SZipFileEntry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar10 = (ulong)index * 0x50;
  uVar2 = *(uint *)(*(long *)(&(this->FileInfo).is_sorted + (long)pp_Var4[-5]) + 0x44 + lVar10);
  uVar1 = pSVar5[uVar2].header.CompressionMethod;
  if (uVar1 < 0xc) {
    pSVar5 = pSVar5 + uVar2;
    uVar2 = (pSVar5->header).DataDescriptor.CompressedSize;
    areaSize = (ulong)uVar2;
    if (uVar1 == 0) {
      pIVar9 = createLimitReadFile((path *)(*(long *)(&(this->FileInfo).is_sorted +
                                                     (long)pp_Var4[-5]) + lVar10 + 0x20),this->File,
                                   (long)pSVar5->Offset,areaSize);
      return pIVar9;
    }
    if (uVar1 == 8) {
      uVar3 = (pSVar5->header).DataDescriptor.UncompressedSize;
      pvVar7 = operator_new__((ulong)uVar3);
      pvVar8 = operator_new__(areaSize);
      (*this->File->_vptr_IReadFile[1])(this->File,(long)pSVar5->Offset,0);
      (**this->File->_vptr_IReadFile)(this->File,pvVar8,areaSize);
      local_60 = 0;
      uStack_58 = 0;
      local_a0 = pvVar8;
      local_98 = uVar2;
      local_88 = pvVar7;
      local_80 = uVar3;
      iVar6 = inflateInit2_(&local_a0,0xfffffff1,"1.2.11",0x70);
      if (iVar6 != 0) {
        operator_delete__(pvVar8);
        snprintf((char *)aPStack_e8,0x40,"Error decompressing %s",
                 *(undefined8 *)
                  (*(long *)(&(this->FileInfo).is_sorted + (long)this->_vptr_CZipReader[-5]) + 0x20
                  + lVar10));
        os::Printer::log(aPStack_e8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        operator_delete__(pvVar7);
        return (IReadFile *)0x0;
      }
      inflate(&local_a0,4);
      inflateEnd(&local_a0);
      inflateEnd(&local_a0);
      operator_delete__(pvVar8);
      iVar6 = (*this->FileSystem->_vptr_IFileSystem[1])
                        (this->FileSystem,pvVar7,(ulong)uVar3,
                         *(long *)(&(this->FileInfo).is_sorted + (long)this->_vptr_CZipReader[-5]) +
                         0x20 + lVar10,1);
      return (IReadFile *)CONCAT44(extraout_var,iVar6);
    }
LAB_0020a252:
    snprintf((char *)aPStack_e8,0x40,"file has unsupported compression method. %s",
             *(undefined8 *)
              (*(long *)(&(this->FileInfo).is_sorted + (long)pp_Var4[-5]) + 0x20 + lVar10));
    os::Printer::log(aPStack_e8,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  }
  else {
    if (uVar1 == 0xc) {
      this_00 = "bzip2 decompression not supported. File cannot be read.";
    }
    else if (uVar1 == 0xe) {
      this_00 = "lzma decompression not supported. File cannot be read.";
    }
    else {
      if (uVar1 != 99) goto LAB_0020a252;
      this_00 = "Decryption support not enabled. File cannot be read.";
    }
    os::Printer::log((Printer *)this_00,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
  }
  return (IReadFile *)0x0;
}

Assistant:

IReadFile *CZipReader::createAndOpenFile(u32 index)
{
	// Irrlicht supports 0, 8, 12, 14, 99
	// 0 - The file is stored (no compression)
	// 1 - The file is Shrunk
	// 2 - The file is Reduced with compression factor 1
	// 3 - The file is Reduced with compression factor 2
	// 4 - The file is Reduced with compression factor 3
	// 5 - The file is Reduced with compression factor 4
	// 6 - The file is Imploded
	// 7 - Reserved for Tokenizing compression algorithm
	// 8 - The file is Deflated
	// 9 - Reserved for enhanced Deflating
	// 10 - PKWARE Date Compression Library Imploding
	// 12 - bzip2 - Compression Method from libbz2, WinZip 10
	// 14 - LZMA - Compression Method, WinZip 12
	// 96 - Jpeg compression - Compression Method, WinZip 12
	// 97 - WavPack - Compression Method, WinZip 11
	// 98 - PPMd - Compression Method, WinZip 10
	// 99 - AES encryption, WinZip 9

	const SZipFileEntry &e = FileInfo[Files[index].ID];
	char buf[64];
	s16 actualCompressionMethod = e.header.CompressionMethod;
	IReadFile *decrypted = 0;
	u8 *decryptedBuf = 0;
	u32 decryptedSize = e.header.DataDescriptor.CompressedSize;
	switch (actualCompressionMethod) {
	case 0: // no compression
	{
		if (decrypted)
			return decrypted;
		else
			return createLimitReadFile(Files[index].FullName, File, e.Offset, decryptedSize);
	}
	case 8: {
		const u32 uncompressedSize = e.header.DataDescriptor.UncompressedSize;
		c8 *pBuf = new c8[uncompressedSize];
		if (!pBuf) {
			snprintf_irr(buf, 64, "Not enough memory for decompressing %s", Files[index].FullName.c_str());
			os::Printer::log(buf, ELL_ERROR);
			if (decrypted)
				decrypted->drop();
			return 0;
		}

		u8 *pcData = decryptedBuf;
		if (!pcData) {
			pcData = new u8[decryptedSize];
			if (!pcData) {
				snprintf_irr(buf, 64, "Not enough memory for decompressing %s", Files[index].FullName.c_str());
				os::Printer::log(buf, ELL_ERROR);
				delete[] pBuf;
				return 0;
			}

			// memset(pcData, 0, decryptedSize);
			File->seek(e.Offset);
			File->read(pcData, decryptedSize);
		}

		// Setup the inflate stream.
		z_stream stream;
		s32 err;

		stream.next_in = (Bytef *)pcData;
		stream.avail_in = (uInt)decryptedSize;
		stream.next_out = (Bytef *)pBuf;
		stream.avail_out = uncompressedSize;
		stream.zalloc = (alloc_func)0;
		stream.zfree = (free_func)0;

		// Perform inflation. wbits < 0 indicates no zlib header inside the data.
		err = inflateInit2(&stream, -MAX_WBITS);
		if (err == Z_OK) {
			err = inflate(&stream, Z_FINISH);
			inflateEnd(&stream);
			if (err == Z_STREAM_END)
				err = Z_OK;
			err = Z_OK;
			inflateEnd(&stream);
		}

		if (decrypted)
			decrypted->drop();
		else
			delete[] pcData;

		if (err != Z_OK) {
			snprintf_irr(buf, 64, "Error decompressing %s", Files[index].FullName.c_str());
			os::Printer::log(buf, ELL_ERROR);
			delete[] pBuf;
			return 0;
		} else
			return FileSystem->createMemoryReadFile(pBuf, uncompressedSize, Files[index].FullName, true);
	}
	case 12: {
		os::Printer::log("bzip2 decompression not supported. File cannot be read.", ELL_ERROR);
		return 0;
	}
	case 14: {
		os::Printer::log("lzma decompression not supported. File cannot be read.", ELL_ERROR);
		return 0;
	}
	case 99:
		// If we come here with an encrypted file, decryption support is missing
		os::Printer::log("Decryption support not enabled. File cannot be read.", ELL_ERROR);
		return 0;
	default:
		snprintf_irr(buf, 64, "file has unsupported compression method. %s", Files[index].FullName.c_str());
		os::Printer::log(buf, ELL_ERROR);
		return 0;
	};
}